

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandLogicPush(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLutSize;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nLutSize = 4;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Kvh"), iVar5 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else {
        if (pAVar3->ntkType == ABC_NTK_LOGIC) {
          uVar2 = Abc_NtkGetFaninMax(pAVar3);
          if ((int)nLutSize <= (int)uVar2) {
            nLutSize = uVar2;
          }
          Abc_NtkToSop(pAVar3,-1,1000000000);
          pAVar3 = Abc_NtkOptPush(pAVar3,nLutSize,fVerbose);
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
          return 0;
        }
        pcVar4 = "This command can only be applied to a logic network.\n";
      }
      iVar5 = -1;
      goto LAB_002243b5;
    }
    if (iVar1 != 0x4b) goto LAB_0022434d;
    if (argc <= globalUtilOptind) break;
    nLutSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)nLutSize < 0) {
LAB_0022434d:
      iVar5 = -2;
      Abc_Print(-2,"usage: logicpush [-K num] [-vh]\n");
      Abc_Print(-2,"\t           performs logic pushing to reduce structural bias\n");
      Abc_Print(-2,"\t-K <num> : the LUT size used in the mapping [default = %d]\n",(ulong)nLutSize)
      ;
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar4);
      pcVar4 = "\t-h       : print the command usage\n";
LAB_002243b5:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by a positive integer.\n");
  goto LAB_0022434d;
}

Assistant:

int Abc_CommandLogicPush( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkOptPush( Abc_Ntk_t * pNtk, int nLutSize, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtkRes;
    int nLutSize = 4;
    int fVerbose = 0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    nLutSize = Abc_MaxInt( nLutSize, Abc_NtkGetFaninMax(pNtk) );
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    pNtkRes = Abc_NtkOptPush( pNtk, nLutSize, fVerbose );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: logicpush [-K num] [-vh]\n" );
    Abc_Print( -2, "\t           performs logic pushing to reduce structural bias\n" );
    Abc_Print( -2, "\t-K <num> : the LUT size used in the mapping [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}